

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

Literals * __thiscall
anon_unknown.dwarf_5fce8::CtorEvalExternalInterface::callTable
          (Literals *__return_storage_ptr__,CtorEvalExternalInterface *this,Name tableName,
          Address index,HeapType sig,Literals *arguments,Type result,EvallingModuleRunner *instance)

{
  pointer puVar1;
  char *pcVar2;
  Literals *__return_storage_ptr___00;
  undefined1 auVar3 [8];
  size_t sVar4;
  uint uVar5;
  long lVar6;
  ElementSegment *pEVar7;
  string *psVar8;
  ulong uVar9;
  pointer puVar10;
  Name name;
  Name NVar11;
  Name NVar12;
  SmallVector<wasm::Literal,_1UL> local_170;
  string local_138 [32];
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  uintptr_t local_98;
  Literals *local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 auStack_48 [8];
  Name targetFunc;
  
  NVar11.super_IString.str._M_str = tableName.super_IString.str._M_len;
  NVar11.super_IString.str._M_len = (size_t)this->wasm;
  local_98 = sig.id;
  local_90 = __return_storage_ptr__;
  lVar6 = wasm::Module::getTableOrNull(NVar11);
  if (lVar6 == 0) {
    psVar8 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (local_138,"callTable on non-existing table",(allocator<char> *)&local_68);
    std::__cxx11::string::string(psVar8,local_138);
    __cxa_throw(psVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
                FailToEvalException::~FailToEvalException);
  }
  auStack_48 = (undefined1  [8])0x0;
  targetFunc.super_IString.str._M_len = 0;
  puVar1 = (this->wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (this->wasm->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = targetFunc.super_IString.str._M_len, auVar3 = auStack_48, puVar10 != puVar1;
      puVar10 = puVar10 + 1) {
    pEVar7 = (puVar10->_M_t).
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if (*(char **)(pEVar7 + 0x20) == tableName.super_IString.str._M_str) {
      if (**(char **)(pEVar7 + 0x28) == '\n') {
        uVar9 = 0;
      }
      else {
        if (**(char **)(pEVar7 + 0x28) != '\x0e') {
          wasm::handle_unreachable
                    ("invalid expr type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                     ,0x145);
        }
        uVar5 = wasm::Literal::getInteger();
        uVar9 = (ulong)uVar5;
        pEVar7 = (puVar10->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      }
      if ((uVar9 <= index.addr) &&
         (index.addr < (*(long *)(pEVar7 + 0x40) - *(long *)(pEVar7 + 0x38) >> 3) + uVar9)) {
        pcVar2 = *(char **)(*(long *)(pEVar7 + 0x38) + (index.addr - uVar9) * 8);
        if (*pcVar2 != '+') {
          psVar8 = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_118,"callTable on uninitialized entry",(allocator<char> *)&local_68);
          std::__cxx11::string::string(psVar8,local_118);
          __cxa_throw(psVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
                      FailToEvalException::~FailToEvalException);
        }
        auStack_48 = *(undefined1 (*) [8])(pcVar2 + 0x10);
        targetFunc.super_IString.str._M_len = *(size_t *)(pcVar2 + 0x18);
      }
    }
  }
  if (targetFunc.super_IString.str._M_len == 0) {
    psVar8 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"callTable on index not found in static segments: ",
               (allocator<char> *)((long)&targetFunc.super_IString.str._M_str + 7));
    std::__cxx11::to_string(&local_88,index.addr);
    std::operator+(&local_f8,&local_68,&local_88);
    std::__cxx11::string::string(psVar8,(string *)&local_f8);
    __cxa_throw(psVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
                FailToEvalException::~FailToEvalException);
  }
  NVar12.super_IString.str._M_str = (char *)auStack_48;
  NVar12.super_IString.str._M_len = (size_t)this->wasm;
  lVar6 = wasm::Module::getFunction(NVar12);
  __return_storage_ptr___00 = local_90;
  if (*(uintptr_t *)(lVar6 + 0x38) == local_98) {
    if (*(long *)(lVar6 + 0x20) == 0) {
      wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
                (&local_170,&arguments->super_SmallVector<wasm::Literal,_1UL>);
      name.super_IString.str._M_str = (char *)sVar4;
      name.super_IString.str._M_len = (size_t)auVar3;
      wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunction
                (__return_storage_ptr___00,
                 &instance->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>,name
                 ,(Literals *)&local_170);
      wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_170);
      return __return_storage_ptr___00;
    }
    psVar8 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"callTable on imported function: ",
               (allocator<char> *)((long)&targetFunc.super_IString.str._M_str + 7));
    wasm::IString::toString_abi_cxx11_(&local_88,(IString *)auStack_48);
    std::operator+(&local_b8,&local_68,&local_88);
    std::__cxx11::string::string(psVar8,(string *)&local_b8);
    __cxa_throw(psVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
                FailToEvalException::~FailToEvalException);
  }
  psVar8 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"callTable signature mismatch: ",
             (allocator<char> *)((long)&targetFunc.super_IString.str._M_str + 7));
  wasm::IString::toString_abi_cxx11_(&local_88,(IString *)auStack_48);
  std::operator+(&local_d8,&local_68,&local_88);
  std::__cxx11::string::string(psVar8,(string *)&local_d8);
  __cxa_throw(psVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
              FailToEvalException::~FailToEvalException);
}

Assistant:

Literals callTable(Name tableName,
                     Address index,
                     HeapType sig,
                     Literals& arguments,
                     Type result,
                     EvallingModuleRunner& instance) override {

    std::unordered_map<wasm::Name, std::vector<wasm::Name>>::iterator it;

    auto* table = wasm->getTableOrNull(tableName);
    if (!table) {
      throw FailToEvalException("callTable on non-existing table");
    }

    // Look through the segments and find the function. Segments can overlap,
    // so we want the last one.
    Name targetFunc;
    for (auto& segment : wasm->elementSegments) {
      if (segment->table != tableName) {
        continue;
      }

      Index start;
      // look for the index in this segment. if it has a constant offset, we
      // look in the proper range. if it instead gets a global, we rely on the
      // fact that when not dynamically linking then the table is loaded at
      // offset 0.
      if (auto* c = segment->offset->dynCast<Const>()) {
        start = c->value.getInteger();
      } else if (segment->offset->is<GlobalGet>()) {
        start = 0;
      } else {
        // wasm spec only allows const and global.get there
        WASM_UNREACHABLE("invalid expr type");
      }
      auto end = start + segment->data.size();
      if (start <= index && index < end) {
        auto entry = segment->data[index - start];
        if (auto* get = entry->dynCast<RefFunc>()) {
          targetFunc = get->func;
        } else {
          throw FailToEvalException(
            std::string("callTable on uninitialized entry"));
        }
      }
    }

    if (!targetFunc.is()) {
      throw FailToEvalException(
        std::string("callTable on index not found in static segments: ") +
        std::to_string(index));
    }

    // If this is one of our functions, we can call it; if it was
    // imported, fail.
    auto* func = wasm->getFunction(targetFunc);
    if (func->type != sig) {
      throw FailToEvalException(std::string("callTable signature mismatch: ") +
                                targetFunc.toString());
    }
    if (!func->imported()) {
      return instance.callFunction(targetFunc, arguments);
    } else {
      throw FailToEvalException(
        std::string("callTable on imported function: ") +
        targetFunc.toString());
    }
  }